

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

void UpdateModel(CPpmd7 *p)

{
  uint *puVar1;
  Byte BVar2;
  byte bVar3;
  undefined2 uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  undefined4 uVar8;
  CPpmd_State *pCVar9;
  uint uVar10;
  uint uVar11;
  CTX_PTR pCVar12;
  undefined4 *puVar13;
  void *pvVar14;
  Byte *pBVar15;
  byte bVar16;
  Byte *pBVar17;
  Byte *pBVar18;
  UInt32 n;
  uint uVar19;
  ulong uVar20;
  CPpmd7_Context *pCVar21;
  CPpmd_Void_Ref *pCVar22;
  uint uVar23;
  long lVar24;
  short sVar25;
  ulong uVar26;
  short sVar27;
  CPpmd7_Context *pCVar28;
  uint uVar29;
  CPpmd_State tmp;
  ulong local_40;
  
  pCVar9 = p->FoundState;
  uVar10._0_2_ = pCVar9->SuccessorLow;
  uVar10._2_2_ = pCVar9->SuccessorHigh;
  if ((pCVar9->Freq < 0x1f) && (uVar26 = (ulong)p->MinContext->Suffix, uVar26 != 0)) {
    pBVar15 = p->Base;
    if (*(short *)(pBVar15 + uVar26) == 1) {
      if (pBVar15[uVar26 + 3] < 0x20) {
        pBVar15[uVar26 + 3] = pBVar15[uVar26 + 3] + 1;
      }
    }
    else {
      pBVar18 = pBVar15 + *(uint *)(pBVar15 + uVar26 + 4);
      if (pBVar15[*(uint *)(pBVar15 + uVar26 + 4)] != pCVar9->Symbol) {
        do {
          pBVar17 = pBVar18;
          pBVar18 = pBVar17 + 6;
        } while (pBVar17[6] != pCVar9->Symbol);
        if (pBVar17[1] <= pBVar17[7]) {
          uVar4 = *(undefined2 *)(pBVar17 + 10);
          uVar8 = *(undefined4 *)pBVar18;
          *(undefined2 *)(pBVar17 + 10) = *(undefined2 *)(pBVar17 + 4);
          *(undefined4 *)pBVar18 = *(undefined4 *)pBVar17;
          *(undefined2 *)(pBVar17 + 4) = uVar4;
          *(undefined4 *)pBVar17 = uVar8;
          pBVar18 = pBVar17;
        }
      }
      if (pBVar18[1] < 0x73) {
        pBVar18[1] = pBVar18[1] + 2;
        *(short *)(pBVar15 + uVar26 + 2) = *(short *)(pBVar15 + uVar26 + 2) + 2;
      }
    }
  }
  if (p->OrderFall == 0) {
    pCVar12 = CreateSuccessors(p,1);
    p->MaxContext = pCVar12;
    p->MinContext = pCVar12;
    if (pCVar12 == (CTX_PTR)0x0) goto LAB_0040e154;
    *(int *)&p->FoundState->SuccessorLow = (int)pCVar12 - *(int *)&p->Base;
  }
  else {
    pBVar15 = p->Text;
    BVar2 = p->FoundState->Symbol;
    p->Text = pBVar15 + 1;
    *pBVar15 = BVar2;
    if (p->UnitsStart <= p->Text) {
LAB_0040e154:
      RestartModel(p);
      return;
    }
    pBVar15 = p->Base;
    uVar29 = (int)p->Text - (int)pBVar15;
    if (uVar10 == 0) {
      *(uint *)&p->FoundState->SuccessorLow = uVar29;
      pCVar21 = p->MinContext;
      local_40 = (ulong)(uint)((int)pCVar21 - (int)pBVar15);
    }
    else {
      if (uVar10 <= uVar29) {
        pCVar12 = CreateSuccessors(p,0);
        if (pCVar12 == (CTX_PTR)0x0) goto LAB_0040e154;
        pBVar15 = p->Base;
        uVar10 = (int)pCVar12 - (int)pBVar15;
      }
      local_40 = (ulong)uVar10;
      puVar1 = &p->OrderFall;
      *puVar1 = *puVar1 - 1;
      pCVar21 = p->MinContext;
      if (*puVar1 == 0) {
        p->Text = p->Text + -(ulong)(p->MaxContext != pCVar21);
        uVar29 = uVar10;
      }
    }
    pCVar28 = p->MaxContext;
    if (pCVar28 != pCVar21) {
      uVar5 = pCVar21->NumStats;
      bVar3 = p->FoundState->Freq;
      uVar6 = pCVar21->SummFreq;
      uVar10 = (uint)uVar5;
      do {
        uVar7 = pCVar28->NumStats;
        uVar26 = (ulong)uVar7;
        if (uVar7 == 1) {
          puVar13 = (undefined4 *)AllocUnits(p,0);
          if (puVar13 == (undefined4 *)0x0) goto LAB_0040e154;
          *(undefined2 *)(puVar13 + 1) = *(undefined2 *)((long)&pCVar28->Stats + 2);
          *puVar13 = *(undefined4 *)&pCVar28->SummFreq;
          pBVar15 = p->Base;
          pCVar28->Stats = (int)puVar13 - (int)pBVar15;
          bVar16 = *(byte *)((long)puVar13 + 1) * '\x02';
          if (0x1d < *(byte *)((long)puVar13 + 1)) {
            bVar16 = 0x78;
          }
          *(byte *)((long)puVar13 + 1) = bVar16;
          uVar11 = p->InitEsc + (uint)(3 < uVar5) + (uint)bVar16;
        }
        else {
          if ((uVar7 & 1) == 0) {
            uVar20 = (ulong)(uint)(uVar7 >> 1);
            bVar16 = p->Units2Indx[(uVar7 >> 1) - 1];
            if (bVar16 != p->Units2Indx[uVar20]) {
              pvVar14 = AllocUnits(p,bVar16 + 1);
              if (pvVar14 == (void *)0x0) goto LAB_0040e154;
              pBVar15 = p->Base;
              uVar11 = pCVar28->Stats;
              pCVar22 = (CPpmd_Void_Ref *)(pBVar15 + uVar11);
              lVar24 = 0;
              do {
                *(undefined4 *)((long)pvVar14 + lVar24) = *(undefined4 *)((long)pCVar22 + lVar24);
                *(undefined4 *)((long)pvVar14 + lVar24 + 4) =
                     *(undefined4 *)((long)pCVar22 + lVar24 + 4);
                *(undefined4 *)((long)pvVar14 + lVar24 + 8) =
                     *(undefined4 *)((long)pCVar22 + lVar24 + 8);
                lVar24 = lVar24 + 0xc;
                uVar19 = (int)uVar20 - 1;
                uVar20 = (ulong)uVar19;
              } while (uVar19 != 0);
              *pCVar22 = p->FreeList[bVar16];
              p->FreeList[bVar16] = uVar11;
              pCVar28->Stats = (int)pvVar14 - (int)pBVar15;
            }
          }
          uVar11 = (uint)(ushort)(pCVar28->SummFreq + (ushort)((uint)uVar7 + (uint)uVar7 < uVar10))
                   + (uint)((uint)pCVar28->SummFreq <= (uint)uVar7 * 8 && (uint)uVar7 * 4 <= uVar10)
                     * 2;
        }
        pCVar9 = p->FoundState;
        uVar19 = ((uVar11 & 0xffff) + 6) * (uint)pCVar9->Freq * 2;
        uVar23 = (uVar11 & 0xffff) + ((uint)uVar6 - (bVar3 + uVar10)) + 1;
        if (uVar19 < uVar23 * 6) {
          sVar27 = 3;
          sVar25 = ((ushort)(uVar23 < uVar19) - (ushort)(uVar19 < uVar23 * 4)) + 2;
        }
        else {
          sVar27 = ((-(ushort)(uVar19 < uVar23 * 0xc) - (ushort)(uVar19 < uVar23 * 9)) + 7) -
                   (ushort)(uVar19 < uVar23 * 0xf);
          sVar25 = sVar27;
        }
        pCVar28->SummFreq = sVar27 + (short)uVar11;
        uVar11 = pCVar28->Stats;
        *(short *)(pBVar15 + uVar26 * 6 + (ulong)uVar11 + 2) = (short)uVar29;
        *(short *)(pBVar15 + uVar26 * 6 + (ulong)uVar11 + 4) = (short)(uVar29 >> 0x10);
        pBVar15[uVar26 * 6 + (ulong)uVar11] = pCVar9->Symbol;
        pBVar15[uVar26 * 6 + (ulong)uVar11 + 1] = (Byte)sVar25;
        pCVar28->NumStats = uVar7 + 1;
        pCVar28 = (CPpmd7_Context *)(pBVar15 + pCVar28->Suffix);
      } while (pCVar28 != p->MinContext);
    }
    p->MinContext = (CPpmd7_Context *)(pBVar15 + local_40);
    p->MaxContext = (CPpmd7_Context *)(pBVar15 + local_40);
  }
  return;
}

Assistant:

static void UpdateModel(CPpmd7 *p)
{
  CPpmd_Void_Ref successor, fSuccessor = SUCCESSOR(p->FoundState);
  CTX_PTR c;
  unsigned s0, ns;
  
  if (p->FoundState->Freq < MAX_FREQ / 4 && p->MinContext->Suffix != 0)
  {
    c = SUFFIX(p->MinContext);
    
    if (c->NumStats == 1)
    {
      CPpmd_State *s = ONE_STATE(c);
      if (s->Freq < 32)
        s->Freq++;
    }
    else
    {
      CPpmd_State *s = STATS(c);
      if (s->Symbol != p->FoundState->Symbol)
      {
        do { s++; } while (s->Symbol != p->FoundState->Symbol);
        if (s[0].Freq >= s[-1].Freq)
        {
          SwapStates(&s[0], &s[-1]);
          s--;
        }
      }
      if (s->Freq < MAX_FREQ - 9)
      {
        s->Freq += 2;
        c->SummFreq += 2;
      }
    }
  }

  if (p->OrderFall == 0)
  {
    p->MinContext = p->MaxContext = CreateSuccessors(p, True);
    if (p->MinContext == 0)
    {
      RestartModel(p);
      return;
    }
    SetSuccessor(p->FoundState, REF(p->MinContext));
    return;
  }
  
  *p->Text++ = p->FoundState->Symbol;
  successor = REF(p->Text);
  if (p->Text >= p->UnitsStart)
  {
    RestartModel(p);
    return;
  }
  
  if (fSuccessor)
  {
    if (fSuccessor <= successor)
    {
      CTX_PTR cs = CreateSuccessors(p, False);
      if (cs == NULL)
      {
        RestartModel(p);
        return;
      }
      fSuccessor = REF(cs);
    }
    if (--p->OrderFall == 0)
    {
      successor = fSuccessor;
      p->Text -= (p->MaxContext != p->MinContext);
    }
  }
  else
  {
    SetSuccessor(p->FoundState, successor);
    fSuccessor = REF(p->MinContext);
  }
  
  s0 = p->MinContext->SummFreq - (ns = p->MinContext->NumStats) - (p->FoundState->Freq - 1);
  
  for (c = p->MaxContext; c != p->MinContext; c = SUFFIX(c))
  {
    unsigned ns1;
    UInt32 cf, sf;
    if ((ns1 = c->NumStats) != 1)
    {
      if ((ns1 & 1) == 0)
      {
        /* Expand for one UNIT */
        unsigned oldNU = ns1 >> 1;
        unsigned i = U2I(oldNU);
        if (i != U2I(oldNU + 1))
        {
          void *ptr = AllocUnits(p, i + 1);
          void *oldPtr;
          if (!ptr)
          {
            RestartModel(p);
            return;
          }
          oldPtr = STATS(c);
          MyMem12Cpy(ptr, oldPtr, oldNU);
          InsertNode(p, oldPtr, i);
          c->Stats = STATS_REF(ptr);
        }
      }
      c->SummFreq = (UInt16)(c->SummFreq + (2 * ns1 < ns) + 2 * ((4 * ns1 <= ns) & (c->SummFreq <= 8 * ns1)));
    }
    else
    {
      CPpmd_State *s = (CPpmd_State*)AllocUnits(p, 0);
      if (!s)
      {
        RestartModel(p);
        return;
      }
      *s = *ONE_STATE(c);
      c->Stats = REF(s);
      if (s->Freq < MAX_FREQ / 4 - 1)
        s->Freq <<= 1;
      else
        s->Freq = MAX_FREQ - 4;
      c->SummFreq = (UInt16)(s->Freq + p->InitEsc + (ns > 3));
    }
    cf = 2 * (UInt32)p->FoundState->Freq * (c->SummFreq + 6);
    sf = (UInt32)s0 + c->SummFreq;
    if (cf < 6 * sf)
    {
      cf = 1 + (cf > sf) + (cf >= 4 * sf);
      c->SummFreq += 3;
    }
    else
    {
      cf = 4 + (cf >= 9 * sf) + (cf >= 12 * sf) + (cf >= 15 * sf);
      c->SummFreq = (UInt16)(c->SummFreq + cf);
    }
    {
      CPpmd_State *s = STATS(c) + ns1;
      SetSuccessor(s, successor);
      s->Symbol = p->FoundState->Symbol;
      s->Freq = (Byte)cf;
      c->NumStats = (UInt16)(ns1 + 1);
    }
  }
  p->MaxContext = p->MinContext = CTX(fSuccessor);
}